

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O3

void compress_DDS_alpha_block(uchar *uncompressed,uchar *compressed)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = (uint)uncompressed[3];
  uVar7 = 3;
  uVar4 = (uint)uncompressed[3];
  do {
    bVar1 = uncompressed[uVar7 + 4];
    uVar5 = (uint)bVar1;
    uVar8 = uVar5;
    if (uVar4 < bVar1) {
      uVar8 = uVar4;
    }
    if (uVar3 < uVar5) {
      uVar8 = uVar4;
    }
    uVar4 = uVar8;
    uVar8 = (uint)bVar1;
    if (uVar5 < uVar3) {
      uVar8 = uVar3;
    }
    uVar3 = uVar8;
    uVar7 = uVar7 + 4;
  } while (uVar7 < 0x3c);
  *compressed = (uchar)uVar3;
  compressed[1] = (uchar)uVar4;
  compressed[2] = '\0';
  compressed[3] = '\0';
  compressed[4] = '\0';
  compressed[5] = '\0';
  compressed[6] = '\0';
  compressed[7] = '\0';
  uVar8 = 0x10;
  uVar7 = 0xffffffffffffffff;
  do {
    iVar2 = *(int *)(&DAT_002214e0 +
                    (ulong)((int)((float)(int)(uncompressed[uVar7 + 4] - uVar4) *
                                 (7.9999 / (float)(int)(uVar3 - uVar4))) & 7) * 4);
    sVar6 = (sbyte)(uVar8 & 7);
    compressed[uVar8 >> 3] = compressed[uVar8 >> 3] | (byte)(iVar2 << sVar6);
    if (5 < (uVar8 & 7)) {
      compressed[(ulong)(uVar8 >> 3) + 1] =
           compressed[(ulong)(uVar8 >> 3) + 1] | (byte)(iVar2 >> (8U - sVar6 & 0x1f));
    }
    uVar8 = uVar8 + 3;
    uVar7 = uVar7 + 4;
  } while (uVar7 < 0x3c);
  return;
}

Assistant:

void
	compress_DDS_alpha_block
	(
		const unsigned char *const uncompressed,
		unsigned char compressed[8]
	)
{
	/*	variables	*/
	int i;
	int next_bit;
	int a0, a1;
	float scale_me;
	/*	stupid order	*/
	int swizzle8[] = { 1, 7, 6, 5, 4, 3, 2, 0 };
	/*	get the alpha limits (a0 > a1)	*/
	a0 = a1 = uncompressed[3];
	for( i = 4+3; i < 16*4; i += 4 )
	{
		if( uncompressed[i] > a0 )
		{
			a0 = uncompressed[i];
		} else if( uncompressed[i] < a1 )
		{
			a1 = uncompressed[i];
		}
	}
	/*	store those limits, and zero the rest of the compressed dataset	*/
	compressed[0] = a0;
	compressed[1] = a1;
	/*	zero out the compressed data	*/
	compressed[2] = 0;
	compressed[3] = 0;
	compressed[4] = 0;
	compressed[5] = 0;
	compressed[6] = 0;
	compressed[7] = 0;
	/*	store the all of the alpha values	*/
	next_bit = 8*2;
	scale_me = 7.9999f / (a0 - a1);
	for( i = 3; i < 16*4; i += 4 )
	{
		/*	convert this alpha value to a 3 bit number	*/
		int svalue;
		int value = (int)((uncompressed[i] - a1) * scale_me);
		svalue = swizzle8[ value&7 ];
		/*	OK, store this value, start with the 1st byte	*/
		compressed[next_bit >> 3] |= svalue << (next_bit & 7);
		if( (next_bit & 7) > 5 )
		{
			/*	spans 2 bytes, fill in the start of the 2nd byte	*/
			compressed[1 + (next_bit >> 3)] |= svalue >> (8 - (next_bit & 7) );
		}
		next_bit += 3;
	}
	/*	done compressing to DXT1	*/
}